

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper4.cpp
# Opt level: O1

void cpp_wrapper_static_open_close
               (planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key,int value)

{
  ion_dictionary_id_t iVar1;
  int32_t actual;
  int32_t actual_00;
  ion_dictionary_size_t iVar2;
  ion_dictionary_type_t iVar3;
  ion_dictionary_parent_t *piVar4;
  ion_dictionary_config_info_t config;
  ion_dictionary_config_info_t config_00;
  ion_dictionary_config_info_t config_01;
  ion_dictionary_config_info_t config_02;
  ion_dictionary_config_info_t config_03;
  ion_dictionary_config_info_t config_04;
  ion_dictionary_config_info_t config_05;
  ulong uVar5;
  long lVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  ion_err_t iVar21;
  planck_unit_result_t pVar22;
  int iStack_64;
  uint uStack_4c;
  
  piVar4 = (dict->dict).instance;
  iVar1 = piVar4->id;
  actual = (piVar4->record).key_size;
  uVar19 = piVar4->key_type;
  uVar20 = (piVar4->record).key_size;
  config_05.key_size = uVar20;
  config_05.type = uVar19;
  uVar17 = piVar4->key_type;
  uVar18 = (piVar4->record).key_size;
  config_04.key_size = uVar18;
  config_04.type = uVar17;
  uVar15 = piVar4->key_type;
  uVar16 = (piVar4->record).key_size;
  config_03.key_size = uVar16;
  config_03.type = uVar15;
  uVar13 = piVar4->key_type;
  uVar14 = (piVar4->record).key_size;
  config_02.key_size = uVar14;
  config_02.type = uVar13;
  uVar11 = piVar4->key_type;
  uVar12 = (piVar4->record).key_size;
  config_01.key_size = uVar12;
  config_01.type = uVar11;
  uVar9 = piVar4->key_type;
  uVar10 = (piVar4->record).key_size;
  config_00.key_size = uVar10;
  config_00.type = uVar9;
  uVar7 = piVar4->key_type;
  uVar8 = (piVar4->record).key_size;
  config.key_size = uVar8;
  config.type = uVar7;
  actual_00 = (piVar4->record).value_size;
  iVar2 = dict->dict_size;
  iVar3 = piVar4->type;
  cpp_wrapper_insert(tc,dict,key,value,'\0');
  cpp_wrapper_get(tc,dict,key,value,'\0',1);
  iVar21 = dictionary_close(&dict->dict);
  (dict->last_status).error = iVar21;
  pVar22 = planck_unit_assert_int_are_equal
                     (tc,0,(int)iVar21,0x44,
                      "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                     );
  if (pVar22 != '\0') {
    switch(iVar3) {
    case dictionary_type_bpp_tree_t:
      uStack_4c = uStack_4c & 0xffffff00;
      dict = (Dictionary<int,_int> *)operator_new(0x80);
      uVar5 = CONCAT44(iStack_64,iVar1) & 0xffffff00ffffffff;
      config.dictionary_size = iVar2;
      config.value_size = actual_00;
      lVar6 = (ulong)uStack_4c << 0x20;
      config.id = (int)uVar5;
      config.use_type = (char)(uVar5 >> 0x20);
      config._5_3_ = (int3)(uVar5 >> 0x28);
      config.dictionary_type = (int)lVar6;
      config.dictionary_status = (char)((ulong)lVar6 >> 0x20);
      config._29_3_ = (int3)((ulong)lVar6 >> 0x28);
      BppTree<int,_int>::BppTree((BppTree<int,_int> *)dict,config);
      break;
    case dictionary_type_flat_file_t:
      iStack_64 = (uint)iStack_64._1_3_ << 8;
      uStack_4c = (uint)uStack_4c._1_3_ << 8;
      dict = (Dictionary<int,_int> *)operator_new(0x80);
      config_03._4_4_ = iStack_64;
      config_03.id = iVar1;
      config_03.dictionary_size = iVar2;
      config_03.value_size = actual_00;
      config_03._28_4_ = uStack_4c;
      config_03.dictionary_type = 1;
      FlatFile<int,_int>::FlatFile((FlatFile<int,_int> *)dict,config_03);
      break;
    case dictionary_type_open_address_file_hash_t:
      iStack_64 = (uint)iStack_64._1_3_ << 8;
      uStack_4c = (uint)uStack_4c._1_3_ << 8;
      dict = (Dictionary<int,_int> *)operator_new(0x80);
      config_01._4_4_ = iStack_64;
      config_01.id = iVar1;
      config_01.dictionary_size = iVar2;
      config_01.value_size = actual_00;
      config_01._28_4_ = uStack_4c;
      config_01.dictionary_type = 2;
      OpenAddressFileHash<int,_int>::OpenAddressFileHash
                ((OpenAddressFileHash<int,_int> *)dict,config_01);
      break;
    case dictionary_type_open_address_hash_t:
      iStack_64 = (uint)iStack_64._1_3_ << 8;
      uStack_4c = (uint)uStack_4c._1_3_ << 8;
      dict = (Dictionary<int,_int> *)operator_new(0x80);
      config_02._4_4_ = iStack_64;
      config_02.id = iVar1;
      config_02.dictionary_size = iVar2;
      config_02.value_size = actual_00;
      config_02._28_4_ = uStack_4c;
      config_02.dictionary_type = 3;
      OpenAddressHash<int,_int>::OpenAddressHash((OpenAddressHash<int,_int> *)dict,config_02);
      break;
    case dictionary_type_skip_list_t:
      iStack_64 = (uint)iStack_64._1_3_ << 8;
      uStack_4c = (uint)uStack_4c._1_3_ << 8;
      dict = (Dictionary<int,_int> *)operator_new(0x80);
      config_00._4_4_ = iStack_64;
      config_00.id = iVar1;
      config_00.dictionary_size = iVar2;
      config_00.value_size = actual_00;
      config_00._28_4_ = uStack_4c;
      config_00.dictionary_type = 4;
      SkipList<int,_int>::SkipList((SkipList<int,_int> *)dict,config_00);
      break;
    case dictionary_type_linear_hash_t:
      iStack_64 = (uint)iStack_64._1_3_ << 8;
      uStack_4c = (uint)uStack_4c._1_3_ << 8;
      dict = (Dictionary<int,_int> *)operator_new(0x80);
      config_04._4_4_ = iStack_64;
      config_04.id = iVar1;
      config_04.dictionary_size = iVar2;
      config_04.value_size = actual_00;
      config_04._28_4_ = uStack_4c;
      config_04.dictionary_type = 5;
      LinearHash<int,_int>::LinearHash((LinearHash<int,_int> *)dict,config_04);
      break;
    case dictionary_type_error_t:
      iStack_64 = (uint)iStack_64._1_3_ << 8;
      uStack_4c = (uint)uStack_4c._1_3_ << 8;
      dict = (Dictionary<int,_int> *)operator_new(0x80);
      config_05._4_4_ = iStack_64;
      config_05.id = iVar1;
      config_05.dictionary_size = iVar2;
      config_05.value_size = actual_00;
      config_05._28_4_ = uStack_4c;
      config_05.dictionary_type = 6;
      SkipList<int,_int>::SkipList((SkipList<int,_int> *)dict,config_05);
      (dict->last_status).error = '\x12';
    }
    pVar22 = planck_unit_assert_int_are_equal
                       (tc,0,(int)(dict->last_status).error,0x72,
                        "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                       );
    if (((pVar22 != '\0') &&
        (pVar22 = planck_unit_assert_int_are_equal
                            (tc,(((dict->dict).instance)->record).key_size,actual,0x73,
                             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                            ), pVar22 != '\0')) &&
       (pVar22 = planck_unit_assert_int_are_equal
                           (tc,(((dict->dict).instance)->record).value_size,actual_00,0x74,
                            "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test4/test_cpp_wrapper4.cpp"
                           ), pVar22 != '\0')) {
      cpp_wrapper_get(tc,dict,key,value,'\0',1);
      if (dict == (Dictionary<int,_int> *)0x0) {
        return;
      }
      iVar21 = dictionary_delete_dictionary(&dict->dict);
      (dict->last_status).error = iVar21;
      operator_delete(dict);
      return;
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
cpp_wrapper_static_open_close(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict,
	int key,
	int value
) {
	ion_err_t				error;
	ion_dictionary_id_t		gdict_id	= dict->dict.instance->id;
	ion_key_size_t			key_size	= dict->dict.instance->record.key_size;
	ion_value_size_t		val_size	= dict->dict.instance->record.value_size;
	ion_key_type_t			key_type	= dict->dict.instance->key_type;
	ion_dictionary_size_t	dict_size	= dict->dict_size;
	ion_dictionary_type_t	dict_type	= dict->dict.instance->type;

	/* Insert test record so we can check data integrity after we close/open */
	cpp_wrapper_insert(tc, dict, key, value, boolean_false);

	/* Check the test record */
	cpp_wrapper_get(tc, dict, key, value, err_ok, 1);

	error = dict->close();

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, error);

	ion_dictionary_config_info_t config = {
		gdict_id, 0, key_type, key_size, val_size, dict_size, dict_type
	};

	int type = 0;

	switch (dict_type) {
		case dictionary_type_bpp_tree_t: {
			dict = BppTree<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_flat_file_t: {
			dict = FlatFile<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_skip_list_t: {
			dict = SkipList<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_open_address_hash_t: {
			dict = OpenAddressHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_open_address_file_hash_t: {
			dict = OpenAddressFileHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_linear_hash_t: {
			dict = LinearHash<int, int>::openDictionary(config, type, type);
			break;
		}

		case dictionary_type_error_t: {
			dict					= SkipList<int, int>::openDictionary(config, type, type);
			dict->last_status.error = err_uninitialized;
			break;
		}
	}

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, err_ok, dict->last_status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dict->dict.instance->record.key_size, key_size);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, dict->dict.instance->record.value_size, val_size);

	/* Check the test record */
	cpp_wrapper_get(tc, dict, key, value, err_ok, 1);

	delete dict;
}